

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

ParseOutput __thiscall
helics::helicsCLI11App::helics_parse<std::__cxx11::string&>
          (helicsCLI11App *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Option *__args;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RDI;
  CallForHelp *ch;
  CallForAllHelp *ca;
  CallForVersion *cv;
  Success *anon_var_0;
  Error *ce;
  Option *opt;
  bool in_stack_00000197;
  string *in_stack_00000198;
  App *in_stack_000001a0;
  value_type *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  allocator<char> *this_01;
  Option *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  App *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> local_81 [17];
  string *in_stack_ffffffffffffff90;
  App *in_stack_ffffffffffffff98;
  
  std::__cxx11::string::string
            (in_stack_ffffffffffffff50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff48);
  CLI::App::parse(in_stack_000001a0,in_stack_00000198,in_stack_00000197);
  std::__cxx11::string::~string(in_stack_ffffffffffffff10);
  *(undefined4 *)(in_RDI + 0x364) = 0;
  CLI::App::remaining_for_passthrough_abi_cxx11_
            (in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff20);
  if ((*(byte *)(in_RDI + 0x361) & 1) != 0) {
    this_01 = local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    __args = CLI::App::get_option_no_throw(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_81);
    if ((__args != (Option *)0x0) && (sVar1 = CLI::Option::count((Option *)0x18eb0e), sVar1 != 0)) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (in_RDI + 0x380);
      CLI::Option::as<std::__cxx11::string>(in_stack_ffffffffffffff38);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(this_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_01,(char (*) [9])__args);
    }
  }
  return *(ParseOutput *)(in_RDI + 0x364);
}

Assistant:

ParseOutput helics_parse(Args&&... args) noexcept
    {
        try {
            parse(std::forward<Args>(args)...);
            last_output = ParseOutput::OK;
            remArgs = remaining_for_passthrough();
            if (passConfig) {
                auto* opt = get_option_no_throw("--config");
                if (opt != nullptr && opt->count() > 0) {
                    remArgs.push_back(opt->as<std::string>());
                    remArgs.emplace_back("--config");
                }
            }
        }
        catch (const CLI::CallForHelp& ch) {
            if (!quiet) {
                exit(ch);
            }
            last_output = ParseOutput::HELP_CALL;
        }
        catch (const CLI::CallForAllHelp& ca) {
            if (!quiet) {
                exit(ca);
            }
            last_output = ParseOutput::HELP_ALL_CALL;
        }
        catch (const CLI::CallForVersion& cv) {
            if (!quiet) {
                exit(cv);
            }
            last_output = ParseOutput::VERSION_CALL;
        }
        catch (const CLI::Success& /*sc*/) {
            last_output = ParseOutput::SUCCESS_TERMINATION;
        }
        catch (const CLI::Error& ce) {
            CLI::App::exit(ce);
            last_output = ParseOutput::PARSE_ERROR;
        }
        catch (...) {
            last_output = ParseOutput::PARSE_ERROR;
        }
        return last_output;
    }